

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O0

int stbi__pic_test_core(stbi__context *s)

{
  int iVar1;
  int local_1c;
  int i;
  stbi__context *s_local;
  
  iVar1 = stbi__pic_is4(s,anon_var_dwarf_85ac);
  if (iVar1 == 0) {
    s_local._4_4_ = 0;
  }
  else {
    for (local_1c = 0; local_1c < 0x54; local_1c = local_1c + 1) {
      stbi__get8(s);
    }
    iVar1 = stbi__pic_is4(s,"PICT");
    if (iVar1 == 0) {
      s_local._4_4_ = 0;
    }
    else {
      s_local._4_4_ = 1;
    }
  }
  return s_local._4_4_;
}

Assistant:

static int stbi__pic_test_core(stbi__context *s)
{
   int i;

   if (!stbi__pic_is4(s,"\x53\x80\xF6\x34"))
      return 0;

   for(i=0;i<84;++i)
      stbi__get8(s);

   if (!stbi__pic_is4(s,"PICT"))
      return 0;

   return 1;
}